

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O3

int riscv_cpu_claim_interrupts_riscv32(RISCVCPU *cpu,uint32_t interrupts)

{
  uint uVar1;
  
  uVar1 = (cpu->env).miclaim;
  if ((uVar1 & interrupts) != 0) {
    return -1;
  }
  (cpu->env).miclaim = uVar1 | interrupts;
  return 0;
}

Assistant:

int riscv_cpu_claim_interrupts(RISCVCPU *cpu, uint32_t interrupts)
{
    CPURISCVState *env = &cpu->env;
    if (env->miclaim & interrupts) {
        return -1;
    } else {
        env->miclaim |= interrupts;
        return 0;
    }
}